

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O3

int gdTransformAffineCopy
              (gdImagePtr dst,int dst_x,int dst_y,gdImagePtr src,gdRectPtr src_region,double *affine
              )

{
  gdInterpolationMethod gVar1;
  int *piVar2;
  long lVar3;
  gdImagePtr pgVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  gdInterpolationMethod id;
  undefined4 in_register_00000014;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  int backup_clipy2;
  int backup_clipx2;
  int backup_clipy1;
  int backup_clipx1;
  gdPointF src_pt;
  gdPointF pt;
  gdRect bbox;
  int c2y;
  int c2x;
  int c1y;
  int c1x;
  double inv [6];
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  ulong local_f0;
  long local_e8;
  ulong local_e0;
  double local_d8;
  long local_d0;
  double local_c8;
  double local_c0;
  gdImagePtr local_b8;
  undefined4 local_ac;
  gdPointF local_a8;
  gdPointF local_98;
  gdRect local_88;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68 [14];
  
  local_e0 = CONCAT44(in_register_00000014,dst_y);
  local_e8 = CONCAT44(local_e8._4_4_,dst_x);
  gVar1 = src->interpolation_id;
  id = GD_DEFAULT;
  if ((gVar1 < GD_POWER) &&
     (id = GD_DEFAULT, (0x10028U >> (gVar1 & (GD_NEAREST_NEIGHBOUR|GD_MITCHELL)) & 1) != 0)) {
    src->interpolation = filter_bicubic;
    src->interpolation_id = GD_BICUBIC;
    id = gVar1;
  }
  gdImageGetClip(src,local_68,(int *)&local_98,(int *)&local_a8,&local_88.x);
  iVar5 = src_region->x;
  iVar7 = src_region->y;
  iVar10 = iVar5 + src_region->width + -1;
  iVar9 = iVar7 + src_region->height + -1;
  iVar11 = local_68[0];
  if (local_68[0] < iVar5) {
    iVar11 = iVar5;
  }
  if (local_a8.x._0_4_ < iVar5) {
    iVar11 = local_a8.x._0_4_;
  }
  src_region->x = iVar11;
  iVar5 = local_98.x._0_4_;
  if (local_98.x._0_4_ < iVar7) {
    iVar5 = iVar7;
  }
  if (local_88.x < iVar7) {
    iVar5 = local_88.x;
  }
  src_region->y = iVar5;
  if (local_68[0] < iVar10) {
    local_68[0] = iVar10;
  }
  if (local_a8.x._0_4_ < iVar10) {
    local_68[0] = local_a8.x._0_4_;
  }
  iVar10 = (local_68[0] - iVar11) + 1;
  iVar7 = local_98.x._0_4_;
  if (local_98.x._0_4_ < iVar9) {
    iVar7 = iVar9;
  }
  src_region->width = iVar10;
  if (local_88.x < iVar9) {
    iVar7 = local_88.x;
  }
  uVar8 = (iVar7 - iVar5) + 1;
  uVar12 = (ulong)uVar8;
  src_region->height = uVar8;
  if ((((iVar11 < 1) && (iVar5 < 1)) && (src->sx <= iVar10)) && (src->sy <= (int)uVar8)) {
    iVar5 = gdTransformAffineBoundingBox(src_region,affine,&local_88);
    local_ac = (undefined4)CONCAT71((int7)(uVar12 >> 8),1);
    if (iVar5 == 0) {
LAB_0011b59f:
      gdImageSetInterpolationMethod(src,id);
      return 0;
    }
  }
  else {
    gdImageGetClip(src,&local_f4,&local_f8,&local_fc,&local_100);
    gdImageSetClip(src,src_region->x,src_region->y,src_region->x + src_region->width + -1,
                   src_region->y + -1 + src_region->height);
    iVar5 = gdTransformAffineBoundingBox(src_region,affine,&local_88);
    if (iVar5 == 0) {
      gdImageSetClip(src,local_f4,local_f8,local_fc,local_100);
      goto LAB_0011b59f;
    }
    local_ac = 0;
  }
  local_b8 = src;
  gdImageGetClip(dst,&local_6c,&local_70,&local_74,&local_78);
  local_f0 = (ulong)(uint)local_88.width;
  iVar5 = -local_88.x;
  if (0 < local_88.x) {
    iVar5 = local_88.x;
  }
  uVar8 = -local_88.y;
  if (0 < local_88.y) {
    uVar8 = local_88.y;
  }
  iVar11 = uVar8 + local_88.height;
  gdAffineInvert((double *)local_68,affine);
  pgVar4 = local_b8;
  iVar7 = (int)local_f0;
  if (dst->alphaBlendingFlag == 0) {
    if (-1 < iVar11) {
      local_d8 = (double)local_88.y;
      iVar9 = (int)local_e8;
      local_c0 = (double)src_region->x;
      local_c8 = (double)src_region->y;
      iVar11 = -local_88.x;
      if (0 < local_88.x) {
        iVar11 = local_88.x;
      }
      local_d0 = (long)(int)local_e0;
      uVar8 = -local_88.y;
      if (0 < local_88.y) {
        uVar8 = local_88.y;
      }
      local_e0 = (ulong)(local_88.height + 1 + uVar8);
      uVar12 = 0;
      local_e8 = (long)(int)local_e8 << 2;
      do {
        lVar3 = local_e8;
        local_98.y = (double)(int)uVar12 + 0.5 + local_d8;
        lVar6 = uVar12 + local_d0;
        if ((-1 < lVar6) && (lVar6 < dst->sy && -1 < iVar5 + local_88.width)) {
          piVar2 = dst->tpixels[lVar6];
          lVar6 = 0;
          do {
            local_98.x = (double)(int)lVar6 + 0.5 + (double)local_88.x;
            gdAffineApplyToPointF(&local_a8,&local_98,(double *)local_68);
            iVar10 = iVar9 + (int)lVar6;
            if ((iVar10 < 0) || (dst->sx <= iVar10)) break;
            iVar10 = getPixelInterpolated
                               (pgVar4,(double)CONCAT44(local_a8.x._4_4_,local_a8.x._0_4_) +
                                       local_c0,local_a8.y + local_c8,-1);
            *(int *)((long)piVar2 + lVar6 * 4 + lVar3) = iVar10;
            lVar6 = lVar6 + 1;
          } while (iVar7 + iVar11 + 1 != (int)lVar6);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != local_e0);
    }
  }
  else if (local_88.y <= iVar11) {
    local_c0 = (double)src_region->x;
    local_c8 = (double)src_region->y;
    iVar9 = -local_88.x;
    if (0 < local_88.x) {
      iVar9 = local_88.x;
    }
    local_f0 = CONCAT44(local_f0._4_4_,iVar7 + 1 + iVar9);
    local_d0 = CONCAT44(local_d0._4_4_,iVar11);
    do {
      local_d8 = (double)(ulong)(uint)local_88.y;
      local_98.y = (double)local_88.y + 0.5;
      if (-1 < iVar5 + local_88.width) {
        iVar7 = (int)local_e0;
        dVar13 = 0.0;
        iVar11 = (int)local_e8;
        iVar9 = (int)local_f0;
        do {
          local_98.x = dVar13 + 0.5;
          gdAffineApplyToPointF(&local_a8,&local_98,(double *)local_68);
          iVar10 = getPixelInterpolated
                             (local_b8,(double)CONCAT44(local_a8.x._4_4_,local_a8.x._0_4_) +
                                       local_c0,local_a8.y + local_c8,0);
          gdImageSetPixel(dst,iVar11,local_88.y + iVar7,iVar10);
          dVar13 = dVar13 + 1.0;
          iVar11 = iVar11 + 1;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      local_88.y = SUB84(local_d8,0) + 1;
    } while (SUB84(local_d8,0) < (int)local_d0);
  }
  pgVar4 = local_b8;
  if ((char)local_ac == '\0') {
    gdImageSetClip(local_b8,local_f4,local_f8,local_fc,local_100);
  }
  gdImageSetInterpolationMethod(pgVar4,id);
  return 1;
}

Assistant:

BGD_DECLARE(int) gdTransformAffineCopy(gdImagePtr dst,
		  int dst_x, int dst_y,
		  const gdImagePtr src,
		  gdRectPtr src_region,
		  const double affine[6])
{
	int c1x,c1y,c2x,c2y;
	int backclip = 0;
	int backup_clipx1, backup_clipy1, backup_clipx2, backup_clipy2;
	register int x, y, src_offset_x, src_offset_y;
	double inv[6];
	int *dst_p;
	gdPointF pt, src_pt;
	gdRect bbox;
	int end_x, end_y;
	gdInterpolationMethod interpolation_id_bak = GD_DEFAULT;

	/* These methods use special implementations */
	if (src->interpolation_id == GD_BILINEAR_FIXED || src->interpolation_id == GD_BICUBIC_FIXED || src->interpolation_id == GD_NEAREST_NEIGHBOUR) {
		interpolation_id_bak = src->interpolation_id;
		
		gdImageSetInterpolationMethod(src, GD_BICUBIC);
	}


	gdImageClipRectangle(src, src_region);

	if (src_region->x > 0 || src_region->y > 0
		|| src_region->width < gdImageSX(src)
		|| src_region->height < gdImageSY(src)) {
		backclip = 1;

		gdImageGetClip(src, &backup_clipx1, &backup_clipy1,
		&backup_clipx2, &backup_clipy2);

		gdImageSetClip(src, src_region->x, src_region->y,
			src_region->x + src_region->width - 1,
			src_region->y + src_region->height - 1);
	}

	if (!gdTransformAffineBoundingBox(src_region, affine, &bbox)) {
		if (backclip) {
			gdImageSetClip(src, backup_clipx1, backup_clipy1,
					backup_clipx2, backup_clipy2);
		}
		gdImageSetInterpolationMethod(src, interpolation_id_bak);
		return GD_FALSE;
	}

	gdImageGetClip(dst, &c1x, &c1y, &c2x, &c2y);

	end_x = bbox.width  + abs(bbox.x);
	end_y = bbox.height + abs(bbox.y);

	/* Get inverse affine to let us work with destination -> source */
	gdAffineInvert(inv, affine);

	src_offset_x =  src_region->x;
	src_offset_y =  src_region->y;

	if (dst->alphaBlendingFlag) {
		for (y = bbox.y; y <= end_y; y++) {
			pt.y = y + 0.5;
			for (x = 0; x <= end_x; x++) {
				pt.x = x + 0.5;
				gdAffineApplyToPointF(&src_pt, &pt, inv);
				gdImageSetPixel(dst, dst_x + x, dst_y + y, getPixelInterpolated(src, src_offset_x + src_pt.x, src_offset_y + src_pt.y, 0));
			}
		}
	} else {
		for (y = 0; y <= end_y; y++) {
			pt.y = y + 0.5 + bbox.y;
			if ((dst_y + y) < 0 || ((dst_y + y) > gdImageSY(dst) -1)) {
				continue;
			}
			dst_p = dst->tpixels[dst_y + y] + dst_x;

			for (x = 0; x <= end_x; x++) {
				pt.x = x + 0.5 + bbox.x;
				gdAffineApplyToPointF(&src_pt, &pt, inv);

				if ((dst_x + x) < 0 || (dst_x + x) > (gdImageSX(dst) - 1)) {
					break;
				}
				*(dst_p++) = getPixelInterpolated(src, src_offset_x + src_pt.x, src_offset_y + src_pt.y, -1);
			}
		}
	}

	/* Restore clip if required */
	if (backclip) {
		gdImageSetClip(src, backup_clipx1, backup_clipy1,
				backup_clipx2, backup_clipy2);
	}

	gdImageSetInterpolationMethod(src, interpolation_id_bak);
	return GD_TRUE;
}